

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

pair<int,_std::array<int,_3UL>_> __thiscall
QPDF::processXRefW(QPDF *this,QPDFObjectHandle *dict,
                  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged
                  )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPDFExc *pQVar4;
  QPDFObjectHandle *this_00;
  long lVar5;
  pair<int,_std::array<int,_3UL>_> pVar6;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  basic_string_view<char,_std::char_traits<char>_> __args_02;
  QPDFObjectHandle W_obj;
  array<int,_3UL> W;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> w_vector;
  QPDFObjectHandle local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&w_vector,"/W",(allocator<char> *)&W)
  ;
  QPDFObjectHandle::getKey(&W_obj,(string *)dict);
  std::__cxx11::string::~string((string *)&w_vector);
  bVar1 = QPDFObjectHandle::isArray(&W_obj);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems(&W_obj);
    if (2 < iVar2) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&w_vector,(int)&W_obj);
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&w_vector);
      if (bVar1) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&W,(int)&W_obj);
        this_00 = (QPDFObjectHandle *)&W;
        bVar1 = QPDFObjectHandle::isInteger(this_00);
        if (bVar1) {
          QPDFObjectHandle::getArrayItem(&local_30,(int)&W_obj);
          bVar1 = QPDFObjectHandle::isInteger(&local_30);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_30.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(W._M_elems + 2));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &w_vector.
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
          if (bVar1) {
            QPDFObjectHandle::getArrayAsVector(&w_vector,&W_obj);
            lVar5 = 0;
            iVar2 = 0;
            while( true ) {
              if (lVar5 == 0x30) {
                if (iVar2 != 0) {
                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                            (&w_vector);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&W_obj.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  pVar6.second._M_elems[0] = W._M_elems[0];
                  pVar6.first = iVar2;
                  pVar6.second._M_elems[1] = W._M_elems[1];
                  pVar6.second._M_elems[2] = W._M_elems[2];
                  return pVar6;
                }
                pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
                __args_02._M_str = "Cross-reference stream\'s /W indicates entry size of 0";
                __args_02._M_len = 0x35;
                std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::
                operator()(pQVar4,damaged,__args_02);
                __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
              }
              iVar3 = QPDFObjectHandle::getIntValueAsInt
                                ((QPDFObjectHandle *)
                                 ((long)&((w_vector.
                                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_BaseHandle).obj.
                                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr + lVar5));
              *(int *)&(this_00->super_BaseHandle).obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = iVar3;
              if (8 < iVar3) break;
              if (iVar3 < 0) {
                pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
                __args_00._M_str = "Cross-reference stream\'s /W contains negative values";
                __args_00._M_len = 0x34;
                std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::
                operator()(pQVar4,damaged,__args_00);
                goto LAB_001e381a;
              }
              iVar2 = iVar2 + iVar3;
              lVar5 = lVar5 + 0x10;
              this_00 = (QPDFObjectHandle *)
                        ((long)&(this_00->super_BaseHandle).obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        4);
            }
            pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
            __args._M_str = "Cross-reference stream\'s /W contains impossibly large values";
            __args._M_len = 0x3c;
            std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::
            operator()(pQVar4,damaged,__args);
LAB_001e381a:
            __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          goto LAB_001e3844;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(W._M_elems + 2));
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &w_vector.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
    }
  }
LAB_001e3844:
  pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
  __args_01._M_str = "Cross-reference stream does not have a proper /W key";
  __args_01._M_len = 0x34;
  std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
            (pQVar4,damaged,__args_01);
  __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::pair<int, std::array<int, 3>>
QPDF::processXRefW(QPDFObjectHandle& dict, std::function<QPDFExc(std::string_view)> damaged)
{
    auto W_obj = dict.getKey("/W");
    if (!(W_obj.isArray() && (W_obj.getArrayNItems() >= 3) && W_obj.getArrayItem(0).isInteger() &&
          W_obj.getArrayItem(1).isInteger() && W_obj.getArrayItem(2).isInteger())) {
        throw damaged("Cross-reference stream does not have a proper /W key");
    }

    std::array<int, 3> W;
    int entry_size = 0;
    auto w_vector = W_obj.getArrayAsVector();
    int max_bytes = sizeof(qpdf_offset_t);
    for (size_t i = 0; i < 3; ++i) {
        W[i] = w_vector[i].getIntValueAsInt();
        if (W[i] > max_bytes) {
            throw damaged("Cross-reference stream's /W contains impossibly large values");
        }
        if (W[i] < 0) {
            throw damaged("Cross-reference stream's /W contains negative values");
        }
        entry_size += W[i];
    }
    if (entry_size == 0) {
        throw damaged("Cross-reference stream's /W indicates entry size of 0");
    }
    return {entry_size, W};
}